

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O3

int cmd_data(char *arg)

{
  int iVar1;
  int iVar2;
  undefined8 *__ptr;
  char *pcVar3;
  FILE *__stream;
  size_t __size;
  lyd_node *plVar4;
  uint uVar5;
  uint uVar6;
  undefined8 *__ptr_00;
  undefined4 local_64;
  lyd_node *plStack_60;
  int option_index;
  lyd_node *data;
  lyd_node *local_50;
  LYD_FORMAT local_48;
  int local_44;
  FILE *local_40;
  uint local_38;
  uint local_34;
  
  local_34 = 0;
  plStack_60 = (lyd_node *)0x0;
  local_40 = _stdout;
  __ptr = (undefined8 *)malloc(0x10);
  pcVar3 = strdup(arg);
  *__ptr = pcVar3;
  strtok(pcVar3," ");
  pcVar3 = strtok((char *)0x0," ");
  if (pcVar3 == (char *)0x0) {
    uVar5 = 1;
  }
  else {
    __size = 0x18;
    uVar5 = 1;
    __ptr_00 = __ptr;
    do {
      __ptr = (undefined8 *)realloc(__ptr_00,__size);
      if (__ptr == (undefined8 *)0x0) {
        cmd_data_cold_1();
        iVar1 = 1;
        local_50 = (lyd_node *)0x0;
        __ptr = __ptr_00;
        __stream = local_40;
        goto LAB_001087c4;
      }
      *(char **)((long)__ptr + (__size - 0x10)) = pcVar3;
      pcVar3 = strtok((char *)0x0," ");
      __size = __size + 8;
      uVar5 = uVar5 + 1;
      __ptr_00 = __ptr;
    } while (pcVar3 != (char *)0x0);
  }
  __ptr[uVar5] = 0;
  _optind = 0;
  uVar6 = 0;
  local_38 = 0;
  data = (lyd_node *)0x0;
  local_50 = (lyd_node *)0x0;
  local_44 = 0;
  local_48 = LYD_UNKNOWN;
switchD_001082ef_caseD_65:
  do {
    while( true ) {
      local_64 = 0;
      iVar1 = getopt_long(uVar5,__ptr,"d:hf:F:o:st:r:",cmd_data::long_options,&local_64);
      __stream = local_40;
      plVar4 = _optarg;
      if (iVar1 < 100) break;
      switch(iVar1) {
      case 100:
        iVar1 = strcmp((char *)_optarg,"all");
        if (iVar1 == 0) {
          local_38 = local_38 & 0xffffff0f | 0x20;
        }
        else {
          iVar1 = strcmp((char *)plVar4,"all-tagged");
          if (iVar1 == 0) {
            local_38 = local_38 & 0xffffff0f | 0x40;
          }
          else {
            iVar1 = strcmp((char *)plVar4,"trim");
            if (iVar1 == 0) {
              local_38 = local_38 & 0xffffff0f | 0x10;
            }
            else {
              iVar1 = strcmp((char *)plVar4,"implicit-tagged");
              if (iVar1 == 0) {
                local_38 = local_38 & 0xffffff0f | 0x80;
              }
            }
          }
        }
        break;
      case 0x66:
        iVar1 = strcmp((char *)_optarg,"xml");
        local_44 = 1;
        if (iVar1 != 0) {
          iVar1 = strcmp((char *)plVar4,"json");
          local_44 = 2;
          if (iVar1 != 0) {
            iVar1 = strcmp((char *)plVar4,"lyb");
            local_44 = 3;
            if (iVar1 != 0) {
              pcVar3 = "Unknown output format \"%s\".\n";
LAB_0010884c:
              fprintf(_stderr,pcVar3,plVar4);
              goto LAB_00108856;
            }
          }
        }
        break;
      case 0x68:
        cmd_data_help();
        iVar1 = 0;
        __stream = local_40;
        goto LAB_001087c4;
      case 0x6f:
        if (data != (lyd_node *)0x0) {
          cmd_data_cold_6();
          goto LAB_00108856;
        }
        data = _optarg;
        break;
      case 0x72:
        if ((local_50 != (lyd_node *)0x0) || ((uVar6 & 0x8000) != 0)) {
          cmd_data_cold_4();
          goto LAB_00108856;
        }
        if (*(char *)&_optarg->schema == '!') {
          uVar6 = uVar6 | 0x8000;
          local_50 = (lyd_node *)0x0;
          local_34 = uVar6;
        }
        else {
          local_50 = (lyd_node *)lyd_parse_path(ctx,_optarg,1,0x10000);
          if (local_50 == (lyd_node *)0x0) {
            cmd_data_cold_5();
            iVar1 = 1;
            local_50 = (lyd_node *)0x0;
            __stream = local_40;
            goto LAB_001087c4;
          }
        }
        break;
      case 0x73:
        uVar6 = uVar6 | 0xa00;
        local_34 = uVar6;
        break;
      case 0x74:
        iVar1 = strcmp((char *)_optarg,"auto");
        if (iVar1 == 0) {
          uVar6 = uVar6 | 0x10000ff;
          local_34 = uVar6;
        }
        else {
          iVar1 = strcmp((char *)plVar4,"data");
          if (iVar1 == 0) {
            uVar6 = uVar6 & 0xfeffff00;
            local_34 = uVar6;
          }
          else {
            iVar1 = strcmp((char *)plVar4,"config");
            if (iVar1 == 0) {
              uVar6 = (uVar6 & 0xfeffff00) + 1;
              local_34 = uVar6;
            }
            else {
              iVar1 = strcmp((char *)plVar4,"get");
              if (iVar1 == 0) {
                uVar6 = uVar6 & 0xfeffff00 | 2;
                local_34 = uVar6;
              }
              else {
                iVar1 = strcmp((char *)plVar4,"getconfig");
                if (iVar1 == 0) {
                  uVar6 = uVar6 & 0xfeffff00 | 4;
                  local_34 = uVar6;
                }
                else {
                  iVar1 = strcmp((char *)plVar4,"edit");
                  if (iVar1 == 0) {
                    uVar6 = uVar6 & 0xfeffff00 | 8;
                    local_34 = uVar6;
                  }
                  else {
                    iVar1 = strcmp((char *)plVar4,"rpc");
                    if (iVar1 == 0) {
                      uVar6 = uVar6 & 0xfeffff00 | 0x10;
                      local_34 = uVar6;
                    }
                    else {
                      iVar1 = strcmp((char *)plVar4,"rpcreply");
                      if (iVar1 == 0) {
                        uVar6 = uVar6 & 0xfeffff00 | 0x20;
                        local_34 = uVar6;
                      }
                      else {
                        iVar1 = strcmp((char *)plVar4,"notif");
                        if (iVar1 == 0) {
                          uVar6 = uVar6 & 0xfeffff00 | 0x40;
                          local_34 = uVar6;
                        }
                        else {
                          iVar1 = strcmp((char *)plVar4,"yangdata");
                          if (iVar1 != 0) {
                            cmd_data_cold_3();
                            goto LAB_00108856;
                          }
                          uVar6 = uVar6 & 0xfeffff00 | 0x1000000;
                          local_34 = uVar6;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (iVar1 == 0x46) {
      iVar1 = strcmp((char *)_optarg,"xml");
      local_48 = LYD_XML;
      if (iVar1 != 0) {
        iVar1 = strcmp((char *)plVar4,"json");
        local_48 = LYD_JSON;
        if (iVar1 != 0) {
          iVar1 = strcmp((char *)plVar4,"lyb");
          local_48 = LYD_LYB;
          if (iVar1 != 0) {
            pcVar3 = "Unknown input format \"%s\".\n";
            goto LAB_0010884c;
          }
        }
      }
      goto switchD_001082ef_caseD_65;
    }
    if (iVar1 == -1) {
      if (_optind == uVar5) {
        cmd_data_cold_8();
        iVar1 = 1;
      }
      else {
        iVar2 = parse_data((char *)__ptr[(int)_optind],local_48,(int *)&local_34,local_50,
                           (char *)__ptr[(long)(int)_optind + 1],&stack0xffffffffffffffa0);
        iVar1 = 1;
        if (iVar2 == 0) {
          if ((data == (lyd_node *)0x0) ||
             (__stream = fopen((char *)data,"w"), __stream != (FILE *)0x0)) {
            iVar1 = 0;
            if (local_44 != 0) {
              plVar4 = plStack_60;
              if ((local_34 & 0x20) != 0) {
                plVar4 = plStack_60->child;
              }
              lyd_print_file(__stream,plVar4,local_44,local_38 | 3);
              iVar1 = 0;
            }
          }
          else {
            cmd_data_cold_7();
            __stream = (FILE *)0x0;
          }
        }
      }
      goto LAB_001087c4;
    }
    if (iVar1 == 0x3f) {
      cmd_data_cold_2();
LAB_00108856:
      iVar1 = 1;
      __stream = local_40;
LAB_001087c4:
      free((void *)*__ptr);
      free(__ptr);
      if ((__stream != (FILE *)0x0) && (__stream != _stdout)) {
        fclose(__stream);
      }
      lyd_free_withsiblings(local_50);
      lyd_free_withsiblings(plStack_60);
      return iVar1;
    }
  } while( true );
}

Assistant:

int
cmd_data(const char *arg)
{
    int c, argc, option_index, ret = 1;
    int options = 0, printopt = 0;
    char **argv = NULL, *ptr;
    const char *out_path = NULL;
    struct lyd_node *data = NULL, *val_tree = NULL;
    LYD_FORMAT outformat = LYD_UNKNOWN, informat = LYD_UNKNOWN;
    FILE *output = stdout;
    static struct option long_options[] = {
        {"defaults", required_argument, 0, 'd'},
        {"help", no_argument, 0, 'h'},
        {"format", required_argument, 0, 'f'},
        {"in-format", required_argument, 0, 'F'},
        {"option", required_argument, 0, 't'},
        {"output", required_argument, 0, 'o'},
        {"running", required_argument, 0, 'r'},
        {"strict", no_argument, 0, 's'},
        {NULL, 0, 0, 0}
    };
    void *rlcd;

    argc = 1;
    argv = malloc(2*sizeof *argv);
    *argv = strdup(arg);
    ptr = strtok(*argv, " ");
    while ((ptr = strtok(NULL, " "))) {
        rlcd = realloc(argv, (argc + 2) * sizeof *argv);
        if (!rlcd) {
            fprintf(stderr, "Memory allocation failed (%s:%d, %s)", __FILE__, __LINE__, strerror(errno));
            goto cleanup;
        }
        argv = rlcd;
        argv[argc++] = ptr;
    }
    argv[argc] = NULL;

    optind = 0;
    while (1) {
        option_index = 0;
        c = getopt_long(argc, argv, "d:hf:F:o:st:r:", long_options, &option_index);
        if (c == -1) {
            break;
        }

        switch (c) {
        case 'd':
            if (!strcmp(optarg, "all")) {
                printopt = (printopt & ~LYP_WD_MASK) | LYP_WD_ALL;
            } else if (!strcmp(optarg, "all-tagged")) {
                printopt = (printopt & ~LYP_WD_MASK) | LYP_WD_ALL_TAG;
            } else if (!strcmp(optarg, "trim")) {
                printopt = (printopt & ~LYP_WD_MASK) | LYP_WD_TRIM;
            } else if (!strcmp(optarg, "implicit-tagged")) {
                printopt = (printopt & ~LYP_WD_MASK) | LYP_WD_IMPL_TAG;
            }
            break;
        case 'h':
            cmd_data_help();
            ret = 0;
            goto cleanup;
        case 'f':
            if (!strcmp(optarg, "xml")) {
                outformat = LYD_XML;
            } else if (!strcmp(optarg, "json")) {
                outformat = LYD_JSON;
            } else if (!strcmp(optarg, "lyb")) {
                outformat = LYD_LYB;
            } else {
                fprintf(stderr, "Unknown output format \"%s\".\n", optarg);
                goto cleanup;
            }
            break;
        case 'F':
            if (!strcmp(optarg, "xml")) {
                informat = LYD_XML;
            } else if (!strcmp(optarg, "json")) {
                informat = LYD_JSON;
            } else if (!strcmp(optarg, "lyb")) {
                informat = LYD_LYB;
            } else {
                fprintf(stderr, "Unknown input format \"%s\".\n", optarg);
                goto cleanup;
            }
            break;
        case 'o':
            if (out_path) {
                fprintf(stderr, "Output specified twice.\n");
                goto cleanup;
            }
            out_path = optarg;
            break;
        case 'r':
            if (val_tree || (options & LYD_OPT_NOEXTDEPS)) {
                fprintf(stderr, "The running datastore (-r) cannot be set multiple times.\n");
                goto cleanup;
            }
            if (optarg[0] == '!') {
                /* ignore extenral dependencies to the running datastore */
                options |= LYD_OPT_NOEXTDEPS;
            } else {
                /* external file with the running datastore */
                val_tree = lyd_parse_path(ctx, optarg, LYD_XML, LYD_OPT_DATA_NO_YANGLIB);
                if (!val_tree) {
                    fprintf(stderr, "Failed to parse the additional data tree for validation.\n");
                    goto cleanup;
                }
            }
            break;
        case 's':
            options |= LYD_OPT_STRICT;
            options |= LYD_OPT_OBSOLETE;
            break;
        case 't':
            if (!strcmp(optarg, "auto")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_TYPEMASK;
            } else if (!strcmp(optarg, "data")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_DATA;
            } else if (!strcmp(optarg, "config")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_CONFIG;
            } else if (!strcmp(optarg, "get")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_GET;
            } else if (!strcmp(optarg, "getconfig")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_GETCONFIG;
            } else if (!strcmp(optarg, "edit")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_EDIT;
            } else if (!strcmp(optarg, "rpc")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_RPC;
            } else if (!strcmp(optarg, "rpcreply")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_RPCREPLY;
            } else if (!strcmp(optarg, "notif")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_NOTIF;
            } else if (!strcmp(optarg, "yangdata")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_DATA_TEMPLATE;
            } else {
                fprintf(stderr, "Invalid parser option \"%s\".\n", optarg);
                cmd_data_help();
                goto cleanup;
            }
            break;
        case '?':
            fprintf(stderr, "Unknown option \"%d\".\n", (char)c);
            goto cleanup;
        }
    }

    /* file name */
    if (optind == argc) {
        fprintf(stderr, "Missing the data file name.\n");
        goto cleanup;
    }

    if (parse_data(argv[optind], informat, &options, val_tree, argv[optind + 1], &data)) {
        goto cleanup;
    }

    if (out_path) {
        output = fopen(out_path, "w");
        if (!output) {
            fprintf(stderr, "Could not open the output file (%s).\n", strerror(errno));
            goto cleanup;
        }
    }

    if (outformat != LYD_UNKNOWN) {
        if (options & LYD_OPT_RPCREPLY) {
            lyd_print_file(output, data->child, outformat, LYP_WITHSIBLINGS | LYP_FORMAT | printopt);
        } else {
            lyd_print_file(output, data, outformat, LYP_WITHSIBLINGS | LYP_FORMAT | printopt);
        }
    }

    ret = 0;

cleanup:
    free(*argv);
    free(argv);

    if (output && (output != stdout)) {
        fclose(output);
    }

    lyd_free_withsiblings(val_tree);
    lyd_free_withsiblings(data);

    return ret;
}